

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O2

void __thiscall Electron::VideoOutput::emplace_pixel_line(VideoOutput *this)

{
  vector<Electron::VideoOutput::DrawAction,_std::allocator<Electron::VideoOutput::DrawAction>_>
  *this_00;
  int local_38 [2];
  
  this_00 = &this->screen_map_;
  local_38[0] = 9;
  local_38[1] = 0;
  std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
  emplace_back<Electron::VideoOutput::DrawAction::Type,int>
            ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
              *)this_00,(Type *)(local_38 + 1),local_38);
  local_38[0] = 0xf;
  local_38[1] = 1;
  std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
  emplace_back<Electron::VideoOutput::DrawAction::Type,int>
            ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
              *)this_00,(Type *)(local_38 + 1),local_38);
  local_38[0] = 9;
  local_38[1] = 2;
  std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
  emplace_back<Electron::VideoOutput::DrawAction::Type,int>
            ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
              *)this_00,(Type *)(local_38 + 1),local_38);
  local_38[0] = 0x50;
  local_38[1] = 3;
  std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
  emplace_back<Electron::VideoOutput::DrawAction::Type,int>
            ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
              *)this_00,(Type *)(local_38 + 1),local_38);
  local_38[0] = 0xf;
  local_38[1] = 2;
  std::vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>::
  emplace_back<Electron::VideoOutput::DrawAction::Type,int>
            ((vector<Electron::VideoOutput::DrawAction,std::allocator<Electron::VideoOutput::DrawAction>>
              *)this_00,(Type *)(local_38 + 1),local_38);
  return;
}

Assistant:

void VideoOutput::emplace_pixel_line() {
	// output format is:
	// 9 cycles: sync
	// ... to 24 cycles: colour burst
	// ... to first_graphics_cycle: blank
	// ... for 80 cycles: pixels
	// ... until end of line: blank
	screen_map_.emplace_back(DrawAction::Sync, 9);
	screen_map_.emplace_back(DrawAction::ColourBurst, 24 - 9);
	screen_map_.emplace_back(DrawAction::Blank, first_graphics_cycle - 24);
	screen_map_.emplace_back(DrawAction::Pixels, 80);
	screen_map_.emplace_back(DrawAction::Blank, 48 - first_graphics_cycle);
}